

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperFastHash.cpp
# Opt level: O1

uint32_t SuperFastHash(char *data,int len,int32_t hash)

{
  uint uVar1;
  int iVar2;
  
  if (data == (char *)0x0 || len < 1) {
    return 0;
  }
  if (3 < (uint)len) {
    iVar2 = ((uint)len >> 2) + 1;
    do {
      uVar1 = ((uint)*(ushort *)data + hash) * 0x10000 ^
              (uint)*(ushort *)((long)data + 2) << 0xb ^ (uint)*(ushort *)data + hash;
      data = (char *)((long)data + 4);
      hash = ((int)uVar1 >> 0xb) + uVar1;
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  switch(len & 3) {
  case 0:
    goto switchD_0016c55b_caseD_0;
  case 1:
    uVar1 = hash + (char)*(ushort *)data;
    uVar1 = uVar1 * 0x400 ^ uVar1;
    iVar2 = (int)uVar1 >> 1;
    break;
  case 2:
    uVar1 = (hash + (uint)*(ushort *)data) * 0x800 ^ hash + (uint)*(ushort *)data;
    iVar2 = (int)uVar1 >> 0x11;
    break;
  case 3:
    uVar1 = (hash + (uint)*(ushort *)data) * 0x10000 ^
            (int)(char)*(ushort *)((long)data + 2) << 0x12 ^ hash + (uint)*(ushort *)data;
    hash = ((int)uVar1 >> 0xb) + uVar1;
    goto switchD_0016c55b_caseD_0;
  }
  hash = iVar2 + uVar1;
switchD_0016c55b_caseD_0:
  uVar1 = hash * 8 ^ hash;
  uVar1 = ((int)uVar1 >> 5) + uVar1;
  uVar1 = uVar1 * 0x10 ^ uVar1;
  uVar1 = ((int)uVar1 >> 0x11) + uVar1;
  uVar1 = uVar1 * 0x2000000 ^ uVar1;
  return ((int)uVar1 >> 6) + uVar1;
}

Assistant:

uint32_t SuperFastHash (const char * data, int len, int32_t hash) {
  uint32_t tmp;
  int rem;

  if (len <= 0 || !data) return 0;

  rem = len & 3;
  len >>= 2;

  /* Main loop */
  for (;len > 0; len--) {
    hash  += get16bits (data);
    tmp    = (get16bits (data+2) << 11) ^ hash;
    hash   = (hash << 16) ^ tmp;
    data  += 2*sizeof (uint16_t);
    hash  += hash >> 11;
  }

  /* Handle end cases */
  switch (rem) {
    case 3:	hash += get16bits (data);
        hash ^= hash << 16;
        hash ^= data[sizeof (uint16_t)] << 18;
        hash += hash >> 11;
        break;
    case 2:	hash += get16bits (data);
        hash ^= hash << 11;
        hash += hash >> 17;
        break;
    case 1: hash += *data;
        hash ^= hash << 10;
        hash += hash >> 1;
  }

  /* Force "avalanching" of final 127 bits */
  hash ^= hash << 3;
  hash += hash >> 5;
  hash ^= hash << 4;
  hash += hash >> 17;
  hash ^= hash << 25;
  hash += hash >> 6;

  return hash;
}